

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int verify_cert(ptls_verify_certificate_t *_self,ptls_t *tls,char *server_name,
               _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
               ptls_iovec_t *certs,size_t num_certs)

{
  X509_STORE *store;
  uint16_t *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  stack_st_X509 *chain;
  X509 *x509;
  X509 *pXVar5;
  X509_STORE_CTX *ctx;
  X509_VERIFY_PARAM *param;
  size_t sVar6;
  EVP_PKEY *pEVar7;
  size_t *psVar8;
  size_t sVar9;
  ptls_iovec_t vec;
  
  chain = (stack_st_X509 *)OPENSSL_sk_new_null();
  iVar2 = 0x2a;
  iVar3 = iVar2;
  if (num_certs == 0) {
    iVar3 = 0x74;
    iVar4 = 0;
    x509 = (X509 *)0x0;
  }
  else {
    x509 = (X509 *)to_x509(*certs);
    if (x509 == (X509 *)0x0) {
      x509 = (X509 *)0x0;
      goto LAB_0010ae65;
    }
    psVar8 = &certs[1].len;
    sVar9 = num_certs;
    while (sVar9 = sVar9 - 1, sVar9 != 0) {
      vec.len = *psVar8;
      vec.base = ((ptls_iovec_t *)(psVar8 + -1))->base;
      pXVar5 = to_x509(vec);
      if (pXVar5 == (X509 *)0x0) goto LAB_0010ae65;
      OPENSSL_sk_push(chain,pXVar5);
      psVar8 = psVar8 + 2;
    }
    store = (X509_STORE *)_self[1].cb;
    iVar3 = ptls_is_server(tls);
    ctx = X509_STORE_CTX_new();
    if (ctx == (X509_STORE_CTX *)0x0) {
      iVar3 = 0x201;
      iVar4 = 0;
      goto LAB_0010ae11;
    }
    iVar4 = X509_STORE_CTX_init(ctx,store,x509,chain);
    if (iVar4 == 1) {
      param = X509_STORE_CTX_get0_param(ctx);
      X509_VERIFY_PARAM_set_purpose(param,(iVar3 == 0) + 1);
      X509_VERIFY_PARAM_set_depth(param,0x62);
      if (server_name != (char *)0x0 && iVar3 == 0) {
        iVar3 = ptls_server_name_is_ipaddr(server_name);
        if (iVar3 == 0) {
          sVar6 = strlen(server_name);
          X509_VERIFY_PARAM_set1_host(param,server_name,sVar6);
          X509_VERIFY_PARAM_set_hostflags(param,4);
        }
        else {
          X509_VERIFY_PARAM_set1_ip_asc(param,server_name);
        }
      }
      iVar3 = X509_verify_cert(ctx);
      if (iVar3 == 1) {
        iVar3 = 0;
        goto LAB_0010ada1;
      }
      iVar4 = X509_STORE_CTX_get_error(ctx);
      switch(iVar4) {
      case 0x11:
        iVar3 = 0x201;
        break;
      case 0x12:
      case 0x13:
      case 0x15:
      case 0x16:
      case 0x18:
      case 0x19:
      case 0x1a:
switchD_0010adf6_caseD_12:
        iVar3 = 0x2e;
        break;
      case 0x14:
      case 0x1b:
      case 0x1c:
switchD_0010adf6_caseD_14:
        iVar3 = 0x30;
        break;
      case 0x17:
        iVar3 = 0x2c;
        break;
      default:
        if (iVar4 - 9U < 2) {
          iVar3 = 0x2d;
        }
        else {
          if (iVar4 == 2) goto switchD_0010adf6_caseD_14;
          if ((iVar4 != 0x3e) && (iVar4 != 0x4f)) goto switchD_0010adf6_caseD_12;
          iVar3 = 0x2a;
        }
      }
    }
    else {
      iVar3 = 0x203;
LAB_0010ada1:
      iVar4 = 0;
    }
    X509_STORE_CTX_free(ctx);
  }
LAB_0010ae11:
  puVar1 = _self[1].algos;
  if (puVar1 != (uint16_t *)0x0) {
    iVar3 = (**(code **)puVar1)(puVar1,tls,iVar3,iVar4,x509,chain);
  }
  if ((num_certs != 0) && (iVar3 == 0)) {
    pEVar7 = X509_get_pubkey(x509);
    *verify_data = pEVar7;
    iVar3 = iVar2;
    if (pEVar7 != (EVP_PKEY *)0x0) {
      *verifier = verify_sign;
      iVar3 = 0;
    }
  }
LAB_0010ae65:
  if (chain != (stack_st_X509 *)0x0) {
    OPENSSL_sk_pop_free(chain,X509_free);
  }
  if (x509 != (X509 *)0x0) {
    X509_free(x509);
  }
  return iVar3;
}

Assistant:

static int verify_cert(ptls_verify_certificate_t *_self, ptls_t *tls, const char *server_name,
                       int (**verifier)(void *, uint16_t, ptls_iovec_t, ptls_iovec_t), void **verify_data, ptls_iovec_t *certs,
                       size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = sk_X509_new_null();
    size_t i;
    int ossl_x509_err, ret;

    /* If any certs are given, convert them to OpenSSL representation, then verify the cert chain. If no certs are given, just give
     * the override_callback to see if we want to stay fail open. */
    if (num_certs != 0) {
        if ((cert = to_x509(certs[0])) == NULL) {
            ret = PTLS_ALERT_BAD_CERTIFICATE;
            goto Exit;
        }
        for (i = 1; i != num_certs; ++i) {
            X509 *interm = to_x509(certs[i]);
            if (interm == NULL) {
                ret = PTLS_ALERT_BAD_CERTIFICATE;
                goto Exit;
            }
            sk_X509_push(chain, interm);
        }
        ret = verify_cert_chain(self->cert_store, cert, chain, ptls_is_server(tls), server_name, &ossl_x509_err);
    } else {
        ret = PTLS_ALERT_CERTIFICATE_REQUIRED;
        ossl_x509_err = 0;
    }

    /* When override callback is available, let it override the error. */
    if (self->override_callback != NULL)
        ret = self->override_callback->cb(self->override_callback, tls, ret, ossl_x509_err, cert, chain);

    if (ret != 0 || num_certs == 0)
        goto Exit;

    /* extract public key for verifying the TLS handshake signature */
    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (chain != NULL)
        sk_X509_pop_free(chain, X509_free);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}